

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_update_temporal_layer_framerate(AV1_COMP *cpi)

{
  int iVar1;
  long lVar2;
  LAYER_CONTEXT *pLVar3;
  int iVar4;
  LAYER_CONTEXT *pLVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pLVar5 = get_layer_context(cpi);
  iVar1 = (cpi->svc).temporal_layer_id;
  dVar9 = cpi->framerate;
  dVar8 = dVar9 / (double)pLVar5->framerate_factor;
  pLVar5->framerate = dVar8;
  lVar2 = pLVar5->target_bandwidth;
  dVar7 = round((double)lVar2 / dVar8);
  iVar4 = (int)dVar7;
  (pLVar5->rc).avg_frame_bandwidth = iVar4;
  (pLVar5->rc).max_frame_bandwidth = (cpi->rc).max_frame_bandwidth;
  if (iVar1 != 0) {
    pLVar3 = (cpi->svc).layer_context;
    lVar6 = (long)((cpi->svc).number_temporal_layers * (cpi->svc).spatial_layer_id + iVar1);
    dVar9 = dVar9 / (double)pLVar3[lVar6 + -1].framerate_factor;
    if (dVar9 < dVar8) {
      dVar9 = round((double)(lVar2 - pLVar3[lVar6 + -1].layer_target_bitrate) / (dVar8 - dVar9));
      iVar4 = (int)dVar9;
    }
  }
  pLVar5->avg_frame_size = iVar4;
  return;
}

Assistant:

void av1_update_temporal_layer_framerate(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *const lc = get_layer_context(cpi);
  RATE_CONTROL *const lrc = &lc->rc;
  const int tl = svc->temporal_layer_id;
  lc->framerate = cpi->framerate / lc->framerate_factor;
  lrc->avg_frame_bandwidth = (int)round(lc->target_bandwidth / lc->framerate);
  lrc->max_frame_bandwidth = cpi->rc.max_frame_bandwidth;
  // Update the average layer frame size (non-cumulative per-frame-bw).
  if (tl == 0) {
    lc->avg_frame_size = lrc->avg_frame_bandwidth;
  } else {
    int prev_layer = svc->spatial_layer_id * svc->number_temporal_layers +
                     svc->temporal_layer_id - 1;
    LAYER_CONTEXT *const lcprev = &svc->layer_context[prev_layer];
    const double prev_layer_framerate =
        cpi->framerate / lcprev->framerate_factor;
    const int64_t prev_layer_target_bandwidth = lcprev->layer_target_bitrate;
    if (lc->framerate > prev_layer_framerate) {
      lc->avg_frame_size =
          (int)round((lc->target_bandwidth - prev_layer_target_bandwidth) /
                     (lc->framerate - prev_layer_framerate));
    } else {
      lc->avg_frame_size = (int)round(lc->target_bandwidth / lc->framerate);
    }
  }
}